

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

void __thiscall
ArgsManager::logArgsPrefix
          (ArgsManager *this,string *prefix,string *section,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          *args)

{
  long lVar1;
  _Base_ptr p_Var2;
  optional<unsigned_int> oVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  allocator<char> local_79;
  string value_str;
  string section_str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (section->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&section_str,"",(allocator<char> *)&value_str);
  }
  else {
    std::operator+(&value_str,"[",section);
    std::operator+(&section_str,&value_str,"] ");
    std::__cxx11::string::~string((string *)&value_str);
  }
  for (p_Var4 = (args->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(args->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    p_Var2 = p_Var4[2]._M_parent;
    for (p_Var5 = *(_Base_ptr *)(p_Var4 + 2); p_Var5 != p_Var2;
        p_Var5 = (_Base_ptr)&p_Var5[2]._M_right) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_str
                     ,'-',(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (p_Var4 + 1));
      oVar3 = GetArgFlags(this,&value_str);
      std::__cxx11::string::~string((string *)&value_str);
      if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
        if ((oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload >> 10 & 1) == 0) {
          UniValue::write_abi_cxx11_((UniValue *)&value_str,(int)p_Var5,(void *)0x0,0);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&value_str,"****",&local_79);
        }
        logging_function._M_str = "logArgsPrefix";
        logging_function._M_len = 0xd;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
        ;
        source_file._M_len = 0x5f;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (logging_function,source_file,0x351,ALL,Info,(ConstevalFormatString<4U>)0x706c7d,
                   prefix,&section_str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1)
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_str)
        ;
        std::__cxx11::string::~string((string *)&value_str);
      }
    }
  }
  std::__cxx11::string::~string((string *)&section_str);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ArgsManager::logArgsPrefix(
    const std::string& prefix,
    const std::string& section,
    const std::map<std::string, std::vector<common::SettingsValue>>& args) const
{
    std::string section_str = section.empty() ? "" : "[" + section + "] ";
    for (const auto& arg : args) {
        for (const auto& value : arg.second) {
            std::optional<unsigned int> flags = GetArgFlags('-' + arg.first);
            if (flags) {
                std::string value_str = (*flags & SENSITIVE) ? "****" : value.write();
                LogPrintf("%s %s%s=%s\n", prefix, section_str, arg.first, value_str);
            }
        }
    }
}